

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O2

void __thiscall Qentem::QExpression::QExpression(QExpression *this,QExpression *src)

{
  ExpressionType EVar1;
  undefined8 uVar2;
  
  (this->field_0).SubExpressions.storage_ = (QExpression *)0x0;
  *(undefined8 *)((long)&this->field_0 + 8) = 0;
  this->Operation = src->Operation;
  EVar1 = src->Type;
  this->Type = EVar1;
  if (EVar1 == SubOperation) {
    Array<Qentem::QExpression>::operator=
              ((Array<Qentem::QExpression> *)this,(Array<Qentem::QExpression> *)src);
  }
  else if (EVar1 == Variable) {
    (this->field_0).SubExpressions.storage_ = (src->field_0).SubExpressions.storage_;
  }
  else {
    uVar2 = *(undefined8 *)((long)&src->field_0 + 8);
    (this->field_0).SubExpressions.storage_ = (src->field_0).SubExpressions.storage_;
    *(undefined8 *)((long)&this->field_0 + 8) = uVar2;
  }
  src->Type = Empty;
  return;
}

Assistant:

QExpression(QExpression &&src) noexcept : Operation{src.Operation}, Type{src.Type} {
        switch (src.Type) {
            case ExpressionType::Variable: {
                Variable = src.Variable;
                break;
            }

            case ExpressionType::SubOperation: {
                SubExpressions = Memory::Move(src.SubExpressions);
                break;
            }

            default: {
                Value = src.Value;
                break;
            }
        }

        src.Type = ExpressionType::Empty;
    }